

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  N_Vector u;
  long lVar6;
  long lVar7;
  N_Vector *uS;
  size_t sVar8;
  FILE *pFVar9;
  char *pcVar10;
  char cVar11;
  int iVar12;
  undefined4 uVar13;
  char *__format;
  undefined4 uVar14;
  undefined8 unaff_R12;
  void *cvode_mem;
  SUNContext sunctx;
  sunrealtype t;
  char fname [256];
  void *local_1a0;
  int local_194;
  undefined4 local_190;
  int local_18c;
  undefined8 local_188;
  undefined8 *local_180;
  long local_178;
  long local_170;
  double local_168;
  sunrealtype local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char local_138 [8];
  undefined8 uStack_130;
  undefined1 uStack_128;
  char acStack_127 [247];
  
  local_1a0 = (void *)0x0;
  if (argc < 2) goto LAB_0010256c;
  pcVar10 = argv[1];
  local_194 = strcmp(pcVar10,"-nosensi");
  uVar14 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  if (local_194 == 0) {
    local_18c = -1;
    uVar13 = 0;
  }
  else {
    iVar3 = strcmp(pcVar10,"-sensi");
    if ((iVar3 == 0) && (argc == 4)) {
      pcVar10 = argv[2];
      iVar3 = strcmp(pcVar10,"sim");
      iVar12 = 1;
      if (iVar3 != 0) {
        iVar3 = strcmp(pcVar10,"stg");
        if (iVar3 == 0) {
          iVar12 = 2;
        }
        else {
          iVar3 = strcmp(pcVar10,"stg1");
          iVar12 = 3;
          if (iVar3 != 0) goto LAB_0010256c;
        }
      }
      pcVar10 = argv[3];
      iVar3 = strcmp(pcVar10,"t");
      uVar13 = 0;
      local_18c = iVar12;
      if (iVar3 != 0) {
        iVar3 = strcmp(pcVar10,"f");
        if (iVar3 == 0) goto LAB_0010257c;
        goto LAB_0010256c;
      }
    }
    else {
LAB_0010256c:
      WrongArgs(*argv);
    }
    uVar14 = 0;
    uVar13 = 1;
  }
LAB_0010257c:
  puVar5 = (undefined8 *)malloc(0x18);
  if (puVar5 == (undefined8 *)0x0) {
    main_cold_6();
    return 1;
  }
  *(undefined4 *)puVar5 = 0x47ae147b;
  *(undefined4 *)((long)puVar5 + 4) = 0x3fa47ae1;
  *(undefined4 *)(puVar5 + 1) = 0;
  *(undefined4 *)((long)puVar5 + 0xc) = 0x40c38800;
  puVar5[2] = 0x417c9c3800000000;
  uVar4 = SUNContext_Create(0,&local_188);
  if ((int)uVar4 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(3,local_188);
    if (u == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)u->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    local_1a0 = (void *)CVodeCreate(2,local_188);
    if (local_1a0 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    uVar4 = CVodeInit(0,local_1a0,f,u);
    if ((int)uVar4 < 0) {
      pcVar10 = "CVodeInit";
    }
    else {
      uVar4 = CVodeWFtolerances(local_1a0,ewt);
      if ((int)uVar4 < 0) {
        pcVar10 = "CVodeWFtolerances";
      }
      else {
        uVar4 = CVodeSetUserData(local_1a0,puVar5);
        if ((int)uVar4 < 0) {
          pcVar10 = "CVodeSetUserData";
        }
        else {
          lVar6 = SUNDenseMatrix(3,3,local_188);
          if (lVar6 == 0) {
            main_cold_3();
            return 1;
          }
          lVar7 = SUNLinSol_Dense(u,lVar6,local_188);
          if (lVar7 == 0) {
            main_cold_2();
            return 1;
          }
          uVar4 = CVodeSetLinearSolver(local_1a0,lVar7,lVar6);
          if ((int)uVar4 < 0) {
            pcVar10 = "CVodeSetLinearSolver";
          }
          else {
            uVar4 = CVodeSetJacFn(local_1a0,Jac);
            if ((int)uVar4 < 0) {
              pcVar10 = "CVodeSetJacFn";
            }
            else {
              local_178 = lVar7;
              local_170 = lVar6;
              puts(" \n3-species kinetics problem");
              local_180 = puVar5;
              if (local_194 == 0) {
                uS = (N_Vector *)0x0;
                pcVar10 = "Sensitivity: NO ";
LAB_00102800:
                local_190 = uVar14;
                printf(pcVar10);
                puts("\n");
                printf("===========================================");
                puts("============================");
                printf("     T     Q       H      NST           y1");
                puts("           y2           y3    ");
                printf("===========================================");
                puts("============================");
                dVar2 = 0.4;
                iVar3 = 0xc;
                do {
                  local_168 = dVar2;
                  uVar4 = CVode(local_1a0,u,&local_160,1);
                  if ((int)uVar4 < 0) {
                    pcVar10 = "CVode";
LAB_00102c2b:
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,
                            (ulong)uVar4);
                    break;
                  }
                  PrintOutput(local_1a0,local_160,u);
                  if (local_194 != 0) {
                    uVar4 = CVodeGetSens(local_1a0,&local_160,uS);
                    if ((int)uVar4 < 0) {
                      pcVar10 = "CVodeGetSens";
                      goto LAB_00102c2b;
                    }
                    PrintOutputS(uS);
                  }
                  printf("-----------------------------------------");
                  puts("------------------------------");
                  dVar2 = local_168 * 10.0;
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
                puts("\nFinal Statistics:");
                CVodePrintAllStats(local_1a0,_stdout,0);
                builtin_strncpy(local_138,"cvsRober",8);
                uStack_130._0_1_ = 0x74;
                uStack_130._1_7_ = 0x645f4153465f73;
                uStack_128 = 0x6e;
                builtin_strncpy(acStack_127,"s_stats",8);
                sVar8 = strlen(local_138);
                if (local_194 == 0) {
                  builtin_strncpy(local_138 + sVar8,".csv",5);
                  pFVar9 = fopen(local_138,"w");
                  CVodePrintAllStats(local_1a0,pFVar9,1);
                  fclose(pFVar9);
                  N_VDestroy(u);
                  puVar5 = local_180;
                }
                else {
                  if (local_18c == 2) {
                    builtin_strncpy(local_138 + sVar8,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar8) = 0x677473;
                  }
                  else if (local_18c == 1) {
                    builtin_strncpy(local_138 + sVar8,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar8) = 0x6d6973;
                  }
                  else {
                    builtin_strncpy(local_138 + sVar8,"_-sensi_stg1",0xd);
                  }
                  cVar11 = (char)local_190;
                  sVar8 = strlen(local_138);
                  puVar5 = local_180;
                  pcVar10 = local_138 + sVar8;
                  if (cVar11 == '\0') {
                    local_138[sVar8 + 2] = '\0';
                    pcVar10[0] = '_';
                    pcVar10[1] = 't';
                  }
                  else {
                    local_138[sVar8 + 2] = '\0';
                    pcVar10[0] = '_';
                    pcVar10[1] = 'f';
                  }
                  sVar8 = strlen(local_138);
                  builtin_strncpy(local_138 + sVar8,".csv",5);
                  pFVar9 = fopen(local_138,"w");
                  CVodePrintAllStats(local_1a0,pFVar9,1);
                  fclose(pFVar9);
                  N_VDestroy(u);
                  if (local_194 != 0) {
                    N_VDestroyVectorArray(uS,3);
                  }
                }
                free(puVar5);
                CVodeFree(&local_1a0);
                SUNLinSolFree(local_178);
                SUNMatDestroy(local_170);
                SUNContext_Free(&local_188);
                return 0;
              }
              local_158 = *puVar5;
              uStack_150 = puVar5[1];
              local_148 = puVar5[2];
              uS = (N_Vector *)N_VCloneVectorArray(3,u);
              if (uS == (N_Vector *)0x0) {
                main_cold_1();
                return 1;
              }
              lVar6 = 0;
              do {
                N_VConst(0,uS[lVar6]);
                iVar3 = local_18c;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              uVar4 = CVodeSensInit1(local_1a0,3,local_18c,fS,uS);
              if ((int)uVar4 < 0) {
                pcVar10 = "CVodeSensInit";
              }
              else {
                uVar4 = CVodeSensEEtolerances(local_1a0);
                if ((int)uVar4 < 0) {
                  pcVar10 = "CVodeSensEEtolerances";
                }
                else {
                  uVar4 = CVodeSetSensErrCon(local_1a0,uVar13);
                  if ((int)uVar4 < 0) {
                    pcVar10 = "CVodeSetSensErrCon";
                  }
                  else {
                    uVar4 = CVodeSetSensParams(local_1a0,0,&local_158,0);
                    if (-1 < (int)uVar4) {
                      printf("Sensitivity: YES ");
                      pcVar10 = "( STAGGERED1 +";
                      if (iVar3 == 2) {
                        pcVar10 = "( STAGGERED +";
                      }
                      __format = "( SIMULTANEOUS +";
                      if (iVar3 != 1) {
                        __format = pcVar10;
                      }
                      printf(__format);
                      pcVar10 = " FULL ERROR CONTROL )";
                      if ((char)uVar14 != '\0') {
                        pcVar10 = " PARTIAL ERROR CONTROL )";
                      }
                      goto LAB_00102800;
                    }
                    pcVar10 = "CVodeSetSensParams";
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  UserData data;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector* yS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  data      = NULL;
  y         = NULL;
  yS        = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Initialize sensitivity variables (reaction rates for this problem) */
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
   * the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  printf(" \n3-species kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    /* Set parameter scaling factor */
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    /* Set sensitivity initial conditions */
    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    /* Call CVodeSensInit1 to activate forward sensitivity computations
     * and allocate internal memory for COVEDS related to sensitivity
     * calculations. Computes the right-hand sides of the sensitivity
     * ODE, one at a time */
    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, fS, yS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    /* Call CVodeSensEEtolerances to estimate tolerances for sensitivity
     * variables based on the rolerances supplied for states variables and
     * the scaling factor pbar */
    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    /* Set sensitivity analysis optional inputs */
    /* Call CVodeSetSensErrCon to specify the error control strategy for
     * sensitivity variables */
    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    /* Call CVodeSetSensParams to specify problem parameter information for
     * sensitivity calculations */
    retval = CVodeSetSensParams(cvode_mem, NULL, pbar, NULL);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    PrintOutput(cvode_mem, t, y);

    /* Call CVodeGetSens to get the sensitivity solution vector after a
     * successful return from CVode */
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, yS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "cvsRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == CV_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else if (sensi_meth == CV_STAGGERED) { strcat(fname, "_-sensi_stg"); }
    else { strcat(fname, "_-sensi_stg1"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y); /* Free y vector */
  if (sensi) { N_VDestroyVectorArray(yS, NS); /* Free yS vector */ }
  free(data);               /* Free user data */
  CVodeFree(&cvode_mem);    /* Free CVODES memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}